

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O3

llb_build_key_t *
llb_build_key_make_directory_tree_signature(char *path,char **filters,int32_t count_filters)

{
  CAPIBuildKey *this;
  size_t sVar1;
  ulong uVar2;
  StringRef name;
  ArrayRef<llvm::StringRef> values;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_78;
  BuildKey local_60;
  StringList local_40;
  
  local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (StringRef *)0x0;
  local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (StringRef *)0x0;
  local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (StringRef *)0x0;
  if (0 < count_filters) {
    uVar2 = 0;
    do {
      local_60.key.key._M_dataplus._M_p = filters[uVar2];
      if (local_60.key.key._M_dataplus._M_p == (char *)0x0) {
        local_60.key.key._M_string_length = 0;
      }
      else {
        local_60.key.key._M_string_length = strlen(local_60.key.key._M_dataplus._M_p);
      }
      if (local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(StringRef *)&local_60);
      }
      else {
        (local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
         super__Vector_impl_data._M_finish)->Data = local_60.key.key._M_dataplus._M_p;
        (local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
         super__Vector_impl_data._M_finish)->Length = local_60.key.key._M_string_length;
        local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)count_filters != uVar2);
  }
  this = (CAPIBuildKey *)operator_new(0x38);
  if (path == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(path);
  }
  values.Length =
       (long)local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  values.Data = local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                _M_impl.super__Vector_impl_data._M_start;
  llbuild::basic::StringList::StringList<llvm::StringRef>(&local_40,values);
  name.Length = sVar1;
  name.Data = path;
  llbuild::buildsystem::BuildKey::BuildKey<llbuild::basic::StringList>(&local_60,'S',name,&local_40)
  ;
  anon_unknown.dwarf_2bd53f::CAPIBuildKey::CAPIBuildKey(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.key.key._M_dataplus._M_p != &local_60.key.key.field_2) {
    operator_delete(local_60.key.key._M_dataplus._M_p,
                    local_60.key.key.field_2._M_allocated_capacity + 1);
  }
  if (local_40.contents != (char *)0x0) {
    operator_delete__(local_40.contents);
  }
  if (local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start != (StringRef *)0x0) {
    operator_delete(local_78.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_directory_tree_signature(const char *_Nonnull path, const char* const* filters, int32_t count_filters) {
  auto filtersToPass = std::vector<StringRef>();
  for (int i = 0; i < count_filters; i++) {
    filtersToPass.push_back(StringRef(filters[i]));
  }
  
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeDirectoryTreeSignature(StringRef(path), basic::StringList(ArrayRef<StringRef>(filtersToPass))));
}